

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_helper.c
# Opt level: O0

uint32_t helper_v7m_tt_arm(CPUARMState *env,uint32_t addr,uint32_t op)

{
  _Bool _Var1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  byte local_6c;
  _Bool local_6b;
  bool local_6a;
  _Bool local_69;
  uint32_t local_68;
  _Bool is_subpage;
  _Bool targetsec;
  ARMMMUIdx AStack_64;
  _Bool targetpriv;
  uint32_t mregion;
  ARMMMUIdx mmu_idx;
  hwaddr phys_addr;
  undefined1 local_50 [4];
  MemTxAttrs attrs;
  ARMMMUFaultInfo fi;
  int prot;
  _Bool mrvalid;
  _Bool nsrw;
  _Bool nsr;
  _Bool rw;
  _Bool r;
  uint32_t tt_resp;
  byte local_24;
  _Bool local_23;
  byte local_22;
  V8M_SAttributes sattrs;
  _Bool alt;
  _Bool forceunpriv;
  uint32_t op_local;
  uint32_t addr_local;
  CPUARMState *env_local;
  
  sattrs.subpage = (op & 1) != 0;
  local_22 = (op & 2) != 0;
  sattrs._1_4_ = op;
  unique0x1000026b = addr;
  memset(&r,0,7);
  memset(local_50,0,0x14);
  phys_addr._4_4_ = 0;
  local_6a = (env->v7m).secure != 0;
  if ((local_22 & 1) != 0) {
    local_6a = (bool)((local_6a ^ 0xffU) & 1);
  }
  if ((sattrs.subpage & 1U) == 0) {
    _Var1 = arm_v7m_is_handler_mode(env);
    local_6c = 1;
    if (!_Var1) {
      local_6c = ((env->v7m).control[local_6a & 1] & 1) != 0 ^ 0xff;
    }
    local_69 = (_Bool)(local_6c & 1);
  }
  else {
    local_69 = false;
  }
  AStack_64 = arm_v7m_mmu_idx_for_secstate_and_priv_arm(env,(_Bool)(local_6a & 1),local_69);
  iVar2 = arm_current_el(env);
  if ((iVar2 == 0) && ((local_22 & 1) == 0)) {
    bVar3 = false;
    bVar4 = false;
    fi._19_1_ = 0;
    local_68 = 0;
  }
  else {
    pmsav8_mpu_lookup_arm
              (env,stack0xffffffffffffffe4,MMU_DATA_LOAD,AStack_64,(hwaddr *)&mregion,
               (MemTxAttrs *)((long)&phys_addr + 4),&fi.domain,&local_6b,
               (ARMMMUFaultInfo_conflict *)local_50,&local_68);
    fi._19_1_ = local_68 != 0xffffffff;
    if (!(bool)fi._19_1_) {
      local_68 = 0;
    }
    bVar3 = (fi.domain & 1U) != 0;
    bVar4 = (fi.domain & 2U) != 0;
  }
  if ((env->v7m).secure == 0) {
    tt_resp._0_1_ = 1;
    prot._1_1_ = false;
    prot._0_1_ = false;
  }
  else {
    v8m_security_lookup_arm
              (env,stack0xffffffffffffffe4,MMU_DATA_LOAD,AStack_64,(V8M_SAttributes *)&r);
    prot._1_1_ = false;
    if (((byte)tt_resp & 1) != 0) {
      prot._1_1_ = bVar3;
    }
    prot._0_1_ = false;
    if (((byte)tt_resp & 1) != 0) {
      prot._0_1_ = bVar4;
    }
  }
  return (uint)local_24 << 0x18 | (uint)(local_23 & 1) << 0x17 |
         (uint)(((byte)tt_resp ^ 0xff) & 1) << 0x16 | (uint)prot._0_1_ << 0x15 |
         (uint)prot._1_1_ << 0x14 | (uint)bVar4 << 0x13 | (uint)bVar3 << 0x12 |
         (uint)(tt_resp._3_1_ & 1) << 0x11 | (uint)(fi._19_1_ & 1) << 0x10 |
         (uint)tt_resp._2_1_ << 8 | local_68;
}

Assistant:

uint32_t HELPER(v7m_tt)(CPUARMState *env, uint32_t addr, uint32_t op)
{
    /* Implement the TT instruction. op is bits [7:6] of the insn. */
    bool forceunpriv = op & 1;
    bool alt = op & 2;
    V8M_SAttributes sattrs = { 0 };
    uint32_t tt_resp;
    bool r, rw, nsr, nsrw, mrvalid;
    int prot;
    ARMMMUFaultInfo fi = { 0 };
    MemTxAttrs attrs = { 0 };
    hwaddr phys_addr;
    ARMMMUIdx mmu_idx;
    uint32_t mregion;
    bool targetpriv;
    bool targetsec = env->v7m.secure;
    bool is_subpage;

    /*
     * Work out what the security state and privilege level we're
     * interested in is...
     */
    if (alt) {
        targetsec = !targetsec;
    }

    if (forceunpriv) {
        targetpriv = false;
    } else {
        targetpriv = arm_v7m_is_handler_mode(env) ||
            !(env->v7m.control[targetsec] & R_V7M_CONTROL_NPRIV_MASK);
    }

    /* ...and then figure out which MMU index this is */
    mmu_idx = arm_v7m_mmu_idx_for_secstate_and_priv(env, targetsec, targetpriv);

    /*
     * We know that the MPU and SAU don't care about the access type
     * for our purposes beyond that we don't want to claim to be
     * an insn fetch, so we arbitrarily call this a read.
     */

    /*
     * MPU region info only available for privileged or if
     * inspecting the other MPU state.
     */
    if (arm_current_el(env) != 0 || alt) {
        /* We can ignore the return value as prot is always set */
        pmsav8_mpu_lookup(env, addr, MMU_DATA_LOAD, mmu_idx,
                          &phys_addr, &attrs, &prot, &is_subpage,
                          &fi, &mregion);
        if (mregion == -1) {
            mrvalid = false;
            mregion = 0;
        } else {
            mrvalid = true;
        }
        r = prot & PAGE_READ;
        rw = prot & PAGE_WRITE;
    } else {
        r = false;
        rw = false;
        mrvalid = false;
        mregion = 0;
    }

    if (env->v7m.secure) {
        v8m_security_lookup(env, addr, MMU_DATA_LOAD, mmu_idx, &sattrs);
        nsr = sattrs.ns && r;
        nsrw = sattrs.ns && rw;
    } else {
        sattrs.ns = true;
        nsr = false;
        nsrw = false;
    }

    tt_resp = (sattrs.iregion << 24) |
        (sattrs.irvalid << 23) |
        ((!sattrs.ns) << 22) |
        (nsrw << 21) |
        (nsr << 20) |
        (rw << 19) |
        (r << 18) |
        (sattrs.srvalid << 17) |
        (mrvalid << 16) |
        (sattrs.sregion << 8) |
        mregion;

    return tt_resp;
}